

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int x509_check_time(mbedtls_x509_time *before,mbedtls_x509_time *after)

{
  int iVar1;
  
  iVar1 = 1;
  if ((before->year <= after->year) &&
     ((before->year != after->year ||
      ((before->mon <= after->mon &&
       ((before->mon != after->mon ||
        ((((before->day <= after->day &&
           ((before->day != after->day || (before->hour <= after->hour)))) &&
          ((before->day != after->day ||
           ((before->hour != after->hour || (before->min <= after->min)))))) &&
         ((before->day != after->day ||
          (((before->hour != after->hour || (before->min != after->min)) ||
           (before->sec <= after->sec)))))))))))))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int x509_check_time( const mbedtls_x509_time *before, const mbedtls_x509_time *after )
{
    if( before->year  > after->year )
        return( 1 );

    if( before->year == after->year &&
        before->mon   > after->mon )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day   > after->day )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour  > after->hour )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min   > after->min  )
        return( 1 );

    if( before->year == after->year &&
        before->mon  == after->mon  &&
        before->day  == after->day  &&
        before->hour == after->hour &&
        before->min  == after->min  &&
        before->sec   > after->sec  )
        return( 1 );

    return( 0 );
}